

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack16_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0xffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x10;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] & 0xffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[1] >> 0x10;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[2] & 0xffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[2] >> 0x10;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[3] & 0xffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[3] >> 0x10;
  *puVar1 = base + *puVar1;
  return in + 4;
}

Assistant:

uint32_t * unpack16_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}